

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyProgram
               (NegativeTestContext *ctx,ProgramSources *sources,ExpectResult expect)

{
  RenderContext *renderCtx;
  ProgramInfo *pPVar1;
  MessageBuilder *this;
  MessageBuilder local_2b0;
  undefined1 local_120 [8];
  string message;
  undefined1 local_f8 [7];
  bool testFailed;
  ShaderProgram program;
  TestLog *log;
  ExpectResult expect_local;
  ProgramSources *sources_local;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs =
       (deUint64)glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f8,renderCtx,sources);
  message.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_120);
  glu::operator<<((TestLog *)program.m_program.m_info.linkTimeUs,(ShaderProgram *)local_f8);
  if (expect == EXPECT_RESULT_PASS) {
    pPVar1 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_f8);
    message.field_2._M_local_buf[0xf] = ~pPVar1->linkOk & 1;
    std::__cxx11::string::operator=((string *)local_120,"Program did not link.");
  }
  else {
    pPVar1 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_f8);
    message.field_2._M_local_buf[0xf] = pPVar1->linkOk & 1;
    std::__cxx11::string::operator=((string *)local_120,"Program was not expected to link.");
  }
  if ((message.field_2._M_local_buf[0xf] & 1U) != 0) {
    tcu::TestLog::operator<<
              (&local_2b0,(TestLog *)program.m_program.m_info.linkTimeUs,
               (BeginMessageToken *)&tcu::TestLog::Message);
    this = tcu::MessageBuilder::operator<<
                     (&local_2b0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120
                     );
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2b0);
    NegativeTestContext::fail(ctx,(string *)local_120);
  }
  std::__cxx11::string::~string((string *)local_120);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f8);
  return;
}

Assistant:

void verifyProgram(NegativeTestContext& ctx, glu::ProgramSources sources, ExpectResult expect)
{
	DE_ASSERT(expect >= EXPECT_RESULT_PASS && expect < EXPECT_RESULT_LAST);

	tcu::TestLog&				log			= ctx.getLog();
	const glu::ShaderProgram	program		(ctx.getRenderContext(), sources);
	bool						testFailed	= false;
	std::string					message;

	log << program;

	if (expect == EXPECT_RESULT_PASS)
	{
		testFailed = !program.getProgramInfo().linkOk;
		message = "Program did not link.";
	}
	else
	{
		testFailed = program.getProgramInfo().linkOk;
		message = "Program was not expected to link.";
	}

	if (testFailed)
	{
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		ctx.fail(message);
	}
}